

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O1

SQInteger persist_state(HSQUIRRELVM vm)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQObjectType SVar1;
  SQRESULT SVar2;
  char *err;
  HSQOBJECT res;
  SQChar *slotName;
  HSQOBJECT mState;
  HSQOBJECT local_40;
  SQChar *local_30;
  HSQOBJECT local_28;
  
  sq_getstring(vm,2,&local_30);
  sq_push(vm,2);
  SVar2 = sq_get_noerr(vm,4);
  if (-1 < SVar2) {
    return 1;
  }
  sq_getstackobj(vm,4,&local_28);
  sq_push(vm,3);
  sq_push(vm,1);
  SVar2 = sq_call(vm,1,1,1);
  if (SVar2 < 0) {
    err = "Failed to call initializer";
  }
  else {
    SVar1 = sq_gettype(vm,-1);
    if ((int)SVar1 < 0xa000020) {
      if ((SVar1 == OT_ARRAY) || (SVar1 == OT_CLASS)) goto LAB_00175e2a;
    }
    else if ((SVar1 == OT_TABLE) || ((SVar1 == OT_USERDATA || (SVar1 == OT_INSTANCE)))) {
LAB_00175e2a:
      sq_getstackobj(vm,-1,&local_40);
      sq_addref(vm,&local_40);
      sq_pop(vm,1);
      sq_push(vm,2);
      obj._unVal.pTable = local_40._unVal.pTable;
      obj._type = local_40._type;
      obj._flags = local_40._flags;
      obj._5_3_ = local_40._5_3_;
      sq_pushobject(vm,obj);
      sq_newslot(vm,4,0);
      obj_00._unVal.pTable = local_40._unVal.pTable;
      obj_00._type = local_40._type;
      obj_00._flags = local_40._flags;
      obj_00._5_3_ = local_40._5_3_;
      sq_pushobject(vm,obj_00);
      sq_release(vm,&local_40);
      return 1;
    }
    local_40._type = 0;
    local_40._flags = '\0';
    local_40._5_3_ = 0;
    SVar2 = sq_getstring(vm,2,(SQChar **)&local_40);
    if (SVar2 != 0) {
      SVar2 = sqstd_throwerrorf(vm,"Persist \'%s\' is not mutable, probably an error",local_40._0_8_
                               );
      return SVar2;
    }
    err = "Persist is not mutable, probably an error";
  }
  SVar2 = sq_throwerror(vm,err);
  return SVar2;
}

Assistant:

static SQInteger persist_state(HSQUIRRELVM vm)
{
  // arguments:
  // 1 - module 'this', 2 - slot id, 3 - intitializer, 4 - state storage
  SQRAT_ASSERT(sq_gettype(vm, 4) == OT_TABLE);

  const SQChar *slotName;
  sq_getstring(vm, 2, &slotName);

  sq_push(vm, 2); // slot id @ 5
  if (SQ_SUCCEEDED(sq_get_noerr(vm, 4)))
    return 1;

  HSQOBJECT mState;
  sq_getstackobj(vm, 4, &mState);

  sq_push(vm, 3); // initializer
  sq_push(vm, 1); // module 'this'
  if (SQ_FAILED(sq_call(vm, 1, SQTrue, SQTrue)))
    return sq_throwerror(vm, _SC("Failed to call initializer"));

  SQObjectType tp = sq_gettype(vm, -1);
  bool isMutable = tp==OT_TABLE || tp==OT_ARRAY || tp==OT_USERDATA || tp==OT_CLASS || tp==OT_INSTANCE;
  if (!isMutable)
  {
    const SQChar *slotName = nullptr;
    if (sq_getstring(vm, 2, &slotName))
      return sqstd_throwerrorf(vm, _SC("Persist '%s' is not mutable, probably an error"), slotName);
    else
      return sq_throwerror(vm, _SC("Persist is not mutable, probably an error"));
  }

  HSQOBJECT res;
  sq_getstackobj(vm, -1, &res);
  sq_addref(vm, &res);
  sq_pop(vm, 1); // initializer closure

  sq_push(vm, 2); // slot id
  sq_pushobject(vm, res); // initializer result
  sq_newslot(vm, 4, false);

  sq_pushobject(vm, res);
  sq_release(vm, &res);

  return 1;
}